

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::add_neighbor_features(search_private *priv,multi_ex *ec_seq)

{
  uint uVar1;
  value_type peVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_type sVar6;
  reference ppeVar7;
  int *piVar8;
  uint *puVar9;
  ostream *poVar10;
  parameters *ppVar11;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long *in_RDI;
  size_t sz;
  features *fs;
  example *other;
  size_t ns;
  int32_t offset;
  size_t n_id;
  example *me;
  size_t n;
  uint32_t stride_shift;
  uint64_t in_stack_00000170;
  float in_stack_0000017c;
  search_private *in_stack_00000180;
  parameters *in_stack_ffffffffffffff38;
  features *in_stack_ffffffffffffff40;
  char local_b1;
  uint64_t in_stack_ffffffffffffff88;
  search_private *in_stack_ffffffffffffff90;
  features *in_stack_ffffffffffffff98;
  vw **in_stack_ffffffffffffffa0;
  ulong local_30;
  ulong local_20;
  
  sVar5 = v_array<int>::size((v_array<int> *)(in_RDI + 3));
  if (sVar5 != 0) {
    parameters::stride_shift(in_stack_ffffffffffffff38);
    for (local_20 = 0; sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI),
        local_20 < sVar6; local_20 = local_20 + 1) {
      ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,local_20);
      peVar2 = *ppeVar7;
      for (local_30 = 0; sVar5 = v_array<int>::size((v_array<int> *)(in_RDI + 3)), local_30 < sVar5;
          local_30 = local_30 + 1) {
        piVar8 = v_array<int>::operator[]((v_array<int> *)(in_RDI + 3),local_30);
        iVar3 = *piVar8 >> 0x18;
        puVar9 = (uint *)v_array<int>::operator[]((v_array<int> *)(in_RDI + 3),local_30);
        uVar1 = *puVar9;
        in_RDI[0x6a] = (long)peVar2;
        *(undefined4 *)(in_RDI + 0x9e) = 0x3f800000;
        piVar8 = v_array<int>::operator[]((v_array<int> *)(in_RDI + 3),local_30);
        in_RDI[0x69] = (long)(*piVar8 * 0xd1c79f);
        in_RDI[0x9c] = 0x83;
        if ((*(byte *)(*in_RDI + 0x3438) & 1) != 0) {
          in_RDI[0x9d] = (long)neighbor_feature_space_abi_cxx11_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffa0,"",(allocator *)&stack0xffffffffffffff9f);
          std::__cxx11::stringstream::str((string *)(in_RDI + 0x6b));
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
          in_stack_ffffffffffffff40 = (features *)std::operator<<((ostream *)(in_RDI + 0x6d),'@');
          local_b1 = '+';
          if (iVar3 < 1) {
            local_b1 = '-';
          }
          poVar10 = std::operator<<((ostream *)in_stack_ffffffffffffff40,local_b1);
          iVar4 = iVar3;
          if (iVar3 < 1) {
            iVar4 = -iVar3;
          }
          std::operator<<(poVar10,(char)iVar4 + '0');
          if ((uVar1 & 0xff) != 0x20) {
            std::operator<<((ostream *)(in_RDI + 0x6d),(char)uVar1);
          }
        }
        if ((iVar3 < 0) && (local_20 < (ulong)(long)-iVar3)) {
          add_new_feature(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
        }
        else {
          in_stack_ffffffffffffff38 = (parameters *)(local_20 + (long)iVar3);
          ppVar11 = (parameters *)std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
          if (in_stack_ffffffffffffff38 < ppVar11) {
            ppeVar7 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (in_RSI,local_20 + (long)iVar3);
            GD::foreach_feature<Search::search_private,_&Search::add_new_feature,_vw_*>
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
                       ,in_stack_ffffffffffffff88,(float)((ulong)*ppeVar7 >> 0x20));
          }
          else {
            add_new_feature(in_stack_00000180,in_stack_0000017c,in_stack_00000170);
          }
        }
      }
      sVar5 = features::size((features *)0x12d047);
      if ((sVar5 == 0) || ((peVar2->super_example_predict).feature_space[0x83].sum_feat_sq <= 0.0))
      {
        features::clear(in_stack_ffffffffffffff40);
      }
      else {
        v_array<unsigned_char>::push_back
                  ((v_array<unsigned_char> *)in_stack_ffffffffffffff40,
                   &in_stack_ffffffffffffff38->sparse);
        peVar2->total_sum_feat_sq =
             (peVar2->super_example_predict).feature_space[0x83].sum_feat_sq +
             peVar2->total_sum_feat_sq;
        peVar2->num_features = sVar5 + peVar2->num_features;
      }
    }
  }
  return;
}

Assistant:

void add_neighbor_features(search_private& priv, multi_ex& ec_seq)
{
  if (priv.neighbor_features.size() == 0)
    return;

  uint32_t stride_shift = priv.all->weights.stride_shift();
  for (size_t n = 0; n < ec_seq.size(); n++)  // iterate over every example in the sequence
  {
    example& me = *ec_seq[n];
    for (size_t n_id = 0; n_id < priv.neighbor_features.size(); n_id++)
    {
      int32_t offset = priv.neighbor_features[n_id] >> 24;
      size_t ns = priv.neighbor_features[n_id] & 0xFF;

      priv.dat_new_feature_ec = &me;
      priv.dat_new_feature_value = 1.;
      priv.dat_new_feature_idx = priv.neighbor_features[n_id] * 13748127;
      priv.dat_new_feature_namespace = neighbor_namespace;
      if (priv.all->audit)
      {
        priv.dat_new_feature_feature_space = &neighbor_feature_space;
        priv.dat_new_feature_audit_ss.str("");
        priv.dat_new_feature_audit_ss << '@' << ((offset > 0) ? '+' : '-') << (char)(abs(offset) + '0');
        if (ns != ' ')
          priv.dat_new_feature_audit_ss << (char)ns;
      }

      // cerr << "n=" << n << " offset=" << offset << endl;
      if ((offset < 0) && (n < (uint64_t)(-offset)))  // add <s> feature
        add_new_feature(priv, 1., (uint64_t)925871901 << stride_shift);
      else if (n + offset >= ec_seq.size())  // add </s> feature
        add_new_feature(priv, 1., (uint64_t)3824917 << stride_shift);
      else  // this is actually a neighbor
      {
        example& other = *ec_seq[n + offset];
        GD::foreach_feature<search_private, add_new_feature>(priv.all, other.feature_space[ns], priv, me.ft_offset);
      }
    }

    features& fs = me.feature_space[neighbor_namespace];
    size_t sz = fs.size();
    if ((sz > 0) && (fs.sum_feat_sq > 0.))
    {
      me.indices.push_back(neighbor_namespace);
      me.total_sum_feat_sq += fs.sum_feat_sq;
      me.num_features += sz;
    }
    else
      fs.clear();
  }
}